

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::find(CBString *this,char *b,int pos)

{
  uchar *puVar1;
  CBStringException *this_00;
  int iVar2;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar *pdata;
  int iStack_34;
  uchar cx;
  int l;
  int i;
  int iStack_28;
  uchar c0;
  int j;
  int ii;
  int pos_local;
  char *b_local;
  CBString *this_local;
  
  if (b == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,"CBString::CBString::find NULL.",&local_91);
    CBStringException::CBStringException((CBStringException *)local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_70);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if ((uint)(this->super_tagbstring).slen < (uint)pos) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = pos;
    if (*b != '\0') {
      if (pos == (this->super_tagbstring).slen) {
        this_local._4_4_ = -1;
      }
      else if (b[1] == '\0') {
        this_local._4_4_ = find(this,*b,pos);
      }
      else {
        iVar2 = (this->super_tagbstring).slen + -1;
        puVar1 = (this->super_tagbstring).data;
        iStack_28 = -1;
        i = 0;
        pdata._7_1_ = *b;
        iStack_34 = pos;
LAB_001697fe:
        while (iStack_34 < iVar2) {
          if (pdata._7_1_ == puVar1[iStack_34]) {
LAB_0016984b:
            if (i == 0) {
              iStack_28 = iStack_34;
            }
            i = i + 1;
            iStack_34 = iStack_34 + 1;
            pdata._7_1_ = b[i];
            if (pdata._7_1_ == '\0') goto LAB_00169888;
          }
          else {
            if (pdata._7_1_ == puVar1[iStack_34 + 1]) {
              iStack_34 = iStack_34 + 1;
              goto LAB_0016984b;
            }
            iStack_34 = iStack_34 + 2;
          }
        }
        if (((iStack_34 != iVar2) || (pdata._7_1_ != puVar1[iStack_34])) || (b[i + 1] != '\0')) {
          return -1;
        }
LAB_00169888:
        if (iStack_34 != iStack_28 + i) {
          iStack_34 = iStack_34 - i;
          i = 0;
          pdata._7_1_ = *b;
          goto LAB_001697fe;
        }
        this_local._4_4_ = iStack_28;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int CBString::find (const char * b, int pos) const {
int ii, j;
unsigned char c0;
int i, l;
unsigned char cx;
unsigned char * pdata;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::find NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;
	if ('\0' == b[1]) return find (b[0], pos);

	cx = c0 = (unsigned char) b[0];
	l = slen - 1;

	pdata = data;
	for (ii = -1, i = pos, j = 0; i < l;) {
		/* Unrolled current character test */
		if (cx != pdata[i]) {
			if (cx != pdata[1+i]) {
				i += 2;
				continue;
			}
			i++;
		}

		/* Take note if this is the start of a potential match */
		if (0 == j) ii = i;

		/* Shift the test character down by one */
		j++;
		i++;

		/* If this isn't past the last character continue */
		if ('\0' != (cx = b[j])) continue;

		N0:;

		/* If no characters mismatched, then we matched */
		if (i == ii+j) return ii;

		/* Shift back to the beginning */
		i -= j;
		j = 0;
		cx = c0;
	}

	/* Deal with last case if unrolling caused a misalignment */
	if (i == l && cx == pdata[i] && '\0' == b[j+1]) goto N0;

	return BSTR_ERR;
}